

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Amd.h
# Opt level: O0

int Eigen::internal::cs_wclear<int>(int mark,int lemax,int *w,int n)

{
  int k;
  int n_local;
  int *w_local;
  int lemax_local;
  int mark_local;
  
  if ((mark < 2) || (mark_local = mark, mark + lemax < 0)) {
    for (k = 0; k < n; k = k + 1) {
      if (w[k] != 0) {
        w[k] = 1;
      }
    }
    mark_local = 2;
  }
  return mark_local;
}

Assistant:

static StorageIndex cs_wclear (StorageIndex mark, StorageIndex lemax, StorageIndex *w, StorageIndex n)
{
  StorageIndex k;
  if(mark < 2 || (mark + lemax < 0))
  {
    for(k = 0; k < n; k++)
      if(w[k] != 0)
        w[k] = 1;
    mark = 2;
  }
  return (mark);     /* at this point, w[0..n-1] < mark holds */
}